

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

void __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::updateBoundingBox
          (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node)

{
  bool bVar1;
  P_set local_20;
  P_less local_1f;
  P_set local_1e;
  P_less local_1d;
  uint local_1c;
  Node *pNStack_18;
  int d;
  Node *node_local;
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this_local;
  
  pNStack_18 = node;
  node_local = (Node *)this;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    bVar1 = P_less::operator()(&local_1d,pNStack_18->value,this->boundingBoxMin,local_1c);
    if (bVar1) {
      P_set::operator()(&local_1e,this->boundingBoxMin,pNStack_18->value,local_1c);
    }
    else {
      bVar1 = P_less::operator()(&local_1f,this->boundingBoxMax,pNStack_18->value,local_1c);
      if (bVar1) {
        P_set::operator()(&local_20,this->boundingBoxMax,pNStack_18->value,local_1c);
      }
    }
  }
  return;
}

Assistant:

void updateBoundingBox(const Node * const node) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, boundingBoxMin, d)) {
					SET()(boundingBoxMin, node->value, d);
				}
				else if (LESS()(boundingBoxMax, node->value, d)) {
					SET()(boundingBoxMax, node->value, d);
				}
			}
		}